

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
SplitWeakDictionary<int,Js::JavascriptSymbol*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
::
Insert<(JsUtil::SplitWeakDictionary<int,Js::JavascriptSymbol*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>::InsertOperations)2>
          (SplitWeakDictionary<int,Js::JavascriptSymbol*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
           *this,TBKey *key,TBValue *value)

{
  SplitWeakDictionary<int,Js::JavascriptSymbol*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
  *pSVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  hash_t local_34;
  
  lVar11 = *(long *)(this + 8);
  if (lVar11 == 0) {
    SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
    ::Initialize((SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  *)this,0);
    lVar11 = *(long *)(this + 8);
  }
  uVar2 = *key;
  local_34 = PrimePolicy::ModPrime(uVar2 & 0x7fffffff,*(uint *)(this + 0x2c),*(int *)(this + 0x3c));
  uVar8 = *(uint *)(lVar11 + (ulong)local_34 * 4);
  if (-1 < (int)uVar8) {
    do {
      uVar7 = (ulong)uVar8;
      if (*(int *)(*(long *)(this + 0x10) + uVar7 * 8) == *key) {
        Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*>::operator=
                  ((RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *)
                   (uVar7 * 0x10 + *(long *)(this + 0x18)),*value);
        return uVar8;
      }
      uVar8 = *(uint *)(*(long *)(this + 0x10) + 4 + uVar7 * 8);
    } while (-1 < (int)uVar8);
  }
  iVar5 = *(int *)(this + 0x38);
  if (iVar5 == 0) {
    if (*(int *)(this + 0x30) == *(int *)(this + 0x28)) {
      (*(code *)**(undefined8 **)this)(this);
      iVar5 = *(int *)(this + 0x38);
      if (iVar5 != 0) goto LAB_00cd0184;
    }
    iVar5 = *(int *)(this + 0x28);
    iVar9 = *(int *)(this + 0x30);
    if (iVar9 == iVar5) {
      SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
      ::Resize((SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                *)this);
      local_34 = PrimePolicy::ModPrime
                           (uVar2 & 0x7fffffff,*(uint *)(this + 0x2c),*(int *)(this + 0x3c));
      iVar5 = *(int *)(this + 0x28);
      iVar9 = *(int *)(this + 0x30);
    }
    *(int *)(this + 0x30) = iVar9 + 1;
    if (iVar5 < iVar9 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x2ba,"(count <= size)","count <= size");
      if (!bVar4) goto LAB_00cd048d;
      *puVar6 = 0;
      iVar5 = *(int *)(this + 0x28);
    }
    if (iVar5 <= iVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,699,"(index < size)","index < size");
      if (!bVar4) goto LAB_00cd048d;
      *puVar6 = 0;
    }
  }
  else {
LAB_00cd0184:
    if (iVar5 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29d,"(freeCount > 0)","freeCount > 0");
      if (!bVar4) goto LAB_00cd048d;
      *puVar6 = 0;
    }
    iVar9 = *(int *)(this + 0x34);
    if (iVar9 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29e,"(freeList >= 0)","freeList >= 0");
      if (!bVar4) goto LAB_00cd048d;
      *puVar6 = 0;
      iVar9 = *(int *)(this + 0x34);
    }
    if (*(int *)(this + 0x30) <= iVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29f,"(freeList < count)","freeList < count");
      if (!bVar4) goto LAB_00cd048d;
      *puVar6 = 0;
      iVar9 = *(int *)(this + 0x34);
    }
    pSVar1 = this + 0x38;
    *(int *)pSVar1 = *(int *)pSVar1 + -1;
    if (*(int *)pSVar1 != 0) {
      lVar11 = *(long *)(this + 0x10);
      iVar5 = *(int *)(lVar11 + 4 + (long)iVar9 * 8);
      if (-2 < iVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                           ,0x1a9,"(IsFreeEntry(freeEntry))","IsFreeEntry(freeEntry)");
        if (!bVar4) {
LAB_00cd048d:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
        iVar5 = *(int *)(lVar11 + 4 + (long)iVar9 * 8);
      }
      *(int *)(this + 0x34) = -2 - iVar5;
    }
  }
  lVar10 = (long)iVar9;
  *(TBKey *)(*(long *)(this + 0x10) + lVar10 * 8) = *key;
  Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*>::operator=
            ((RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *)
             (lVar10 * 0x10 + *(long *)(this + 0x18)),*value);
  lVar11 = *(long *)(this + 8);
  *(undefined4 *)(*(long *)(this + 0x10) + 4 + lVar10 * 8) =
       *(undefined4 *)(lVar11 + (ulong)local_34 * 4);
  *(int *)(lVar11 + (ulong)local_34 * 4) = iVar9;
  return iVar9;
}

Assistant:

int Insert(const TBKey& key, const TBValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCodeWithKey<TBKey>(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket], last = -1; i >= 0;)
                {
                    TBKey k = this->GetKey(i);
                    if (this->RemoveIfCollected(k, &i, last, targetBucket))
                    {
                        continue;
                    }

                    if (Comparer<TBKey>::Equals(k, key))
                    {
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            SetValue(value, i);
                            return i;
                        }
                        return -1;
                    }

                    last = i;
                    i = localEntries[i].next;
                }
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (freeCount == 0 && count == size)
            {
                this->Cleanup();
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if (freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            SetKeyValue(key, value, index);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

            return index;
        }